

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

void __thiscall wasm::SimplifyGlobals::propagateConstantsToGlobals(SimplifyGlobals *this)

{
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  SmallVector<wasm::Literal,_1UL> *this_00;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *elementSegment;
  pointer puVar6;
  pointer puVar7;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *dataSegment;
  pointer puVar8;
  SmallVector<wasm::Literal,_1UL> local_b8;
  undefined1 local_80 [8];
  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  constantGlobals;
  Builder builder;
  anon_class_16_2_ad9b0d18 applyGlobals;
  
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this->module;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&constantGlobals;
  constantGlobals._M_t._M_impl._0_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar1 = (((Module *)constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count)->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  builder.wasm = (Module *)local_80;
  for (puVar7 = (((Module *)constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count)->
                globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pGVar2 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
      propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                ((anon_class_16_2_ad9b0d18 *)&builder,&pGVar2->init);
      bVar5 = Properties::isConstantExpression
                        (((puVar7->_M_t).
                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
      if (bVar5) {
        getLiteralsFromConstExpression
                  ((Literals *)&local_b8,
                   ((puVar7->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
        this_00 = &std::
                   map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                                 *)local_80,
                                (key_type *)
                                (puVar7->_M_t).
                                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                   super_SmallVector<wasm::Literal,_1UL>;
        SmallVector<wasm::Literal,_1UL>::operator=(this_00,&local_b8);
        SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_b8);
      }
    }
  }
  puVar3 = (this->module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->module->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
              ((anon_class_16_2_ad9b0d18 *)&builder,
               &((puVar6->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset);
  }
  puVar4 = (this->module->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->module->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
    propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
              ((anon_class_16_2_ad9b0d18 *)&builder,
               &((puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               *)local_80);
  return;
}

Assistant:

void propagateConstantsToGlobals() {
    Builder builder(*module);

    // We will note constant globals here as we compute them.
    std::map<Name, Literals> constantGlobals;

    // Given an init expression (something like the init of a global or a
    // segment), see if it is a simple global.get of a constant that we can
    // apply.
    auto applyGlobals = [&](Expression*& init) {
      if (!init) {
        // This is the init of a passive segment, which is null.
        return;
      }
      for (auto** getp : FindAllPointers<GlobalGet>(init).list) {
        auto* get = (*getp)->cast<GlobalGet>();
        auto iter = constantGlobals.find(get->name);
        if (iter != constantGlobals.end()) {
          *getp = builder.makeConstantExpression(iter->second);
        }
      }
    };

    // Go over the list of globals first, and note their constant values as we
    // go, as well as applying them where possible.
    for (auto& global : module->globals) {
      if (!global->imported()) {
        // Apply globals to this value, which may turn it into a constant we can
        // further propagate, or it may already have been one.
        applyGlobals(global->init);
        if (Properties::isConstantExpression(global->init)) {
          constantGlobals[global->name] =
            getLiteralsFromConstExpression(global->init);
        }
      }
    }

    // Go over other things with inits and apply globals there.
    for (auto& elementSegment : module->elementSegments) {
      applyGlobals(elementSegment->offset);
    }
    for (auto& dataSegment : module->dataSegments) {
      applyGlobals(dataSegment->offset);
    }
  }